

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

uint64_t aom_mse_16xh_16bit_c(uint8_t *dst,int dstride,uint16_t *src,int w,int h)

{
  int iVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint16_t *puVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = 0;
  iVar1 = (int)(0x10 / (long)w);
  if (iVar1 < 1) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (h < 1) {
        lVar8 = 0;
      }
      else {
        uVar5 = 0;
        lVar8 = 0;
        puVar4 = dst;
        puVar6 = src;
        do {
          if (0 < w) {
            uVar2 = 0;
            do {
              lVar8 = lVar8 + (ulong)(((uint)puVar4[uVar2] - (uint)puVar6[uVar2]) *
                                     ((uint)puVar4[uVar2] - (uint)puVar6[uVar2]));
              uVar2 = uVar2 + 1;
            } while ((uint)w != uVar2);
          }
          uVar5 = uVar5 + 1;
          puVar6 = puVar6 + w;
          puVar4 = puVar4 + dstride;
        } while (uVar5 != (uint)h);
      }
      uVar3 = uVar3 + lVar8;
      dst = dst + w;
      iVar7 = iVar7 + 1;
      src = src + h * w;
    } while (iVar7 != iVar1);
  }
  return uVar3;
}

Assistant:

uint64_t aom_mse_16xh_16bit_c(uint8_t *dst, int dstride, uint16_t *src, int w,
                              int h) {
  uint16_t *src_temp = src;
  uint8_t *dst_temp = dst;
  const int num_blks = 16 / w;
  int64_t sum = 0;
  for (int i = 0; i < num_blks; i++) {
    sum += aom_mse_wxh_16bit_c(dst_temp, dstride, src_temp, w, w, h);
    dst_temp += w;
    src_temp += (w * h);
  }
  return sum;
}